

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

PropertyIdArray * __thiscall
Js::FunctionBody::AllocatePropertyIdArrayForFormals
          (FunctionBody *this,uint32 size,uint32 count,byte extraSlots)

{
  ScriptContext *this_00;
  Recycler *pRVar1;
  PropertyIdArray *this_01;
  TrackAllocData local_50;
  PropertyIdArray *local_28;
  PropertyIdArray *formalsPropIdArray;
  uint32 local_18;
  uint32 uStack_14;
  byte extraSlots_local;
  uint32 count_local;
  uint32 size_local;
  FunctionBody *this_local;
  
  formalsPropIdArray._7_1_ = extraSlots;
  local_18 = count;
  uStack_14 = size;
  _count_local = this;
  this_00 = FunctionProxy::GetScriptContext((FunctionProxy *)this);
  pRVar1 = ScriptContext::GetRecycler(this_00);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_50,(type_info *)&PropertyIdArray::typeinfo,(ulong)uStack_14,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
             ,0x19a0);
  pRVar1 = Memory::Recycler::TrackAllocInfo(pRVar1,&local_50);
  this_01 = (PropertyIdArray *)new<Memory::Recycler>(8,pRVar1,0x446fd0,0);
  PropertyIdArray::PropertyIdArray(this_01,local_18,formalsPropIdArray._7_1_,false,false,false);
  local_28 = this_01;
  SetFormalsPropIdArray(this,this_01);
  return local_28;
}

Assistant:

PropertyIdArray * FunctionBody::AllocatePropertyIdArrayForFormals(uint32 size, uint32 count, byte extraSlots)
    {
        //TODO: saravind: Should the allocation be a Leaf Allocation?
        PropertyIdArray * formalsPropIdArray = RecyclerNewPlus(GetScriptContext()->GetRecycler(), size, Js::PropertyIdArray, count, extraSlots);
        SetFormalsPropIdArray(formalsPropIdArray);
        return formalsPropIdArray;
    }